

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_sector.cpp
# Opt level: O0

ON_SubDSectorType *
ON_SubDSectorType::CreateDartSectorType
          (ON_SubDSectorType *__return_storage_ptr__,uint sector_face_count)

{
  bool bVar1;
  double local_38;
  double local_30;
  uint local_24;
  ON_SubDSectorType *st;
  ON_SubDVertexTag vertex_tag;
  uint sector_face_count_local;
  
  bVar1 = ON_SubDSectorType_IsValidFaceCountForCreate(Dart,sector_face_count);
  if (bVar1) {
    ON_SubDSectorType(__return_storage_ptr__);
    __return_storage_ptr__->m_vertex_tag = Dart;
    bVar1 = ON_SubDSectorType_IsValidFaceCount(Dart,sector_face_count);
    local_24 = sector_face_count;
    if (!bVar1) {
      local_24 = 0;
    }
    __return_storage_ptr__->m_sector_face_count = local_24;
    if (__return_storage_ptr__->m_sector_face_count == 0) {
      local_30 = -8883.0;
    }
    else {
      local_30 = DartSectorCoefficient(sector_face_count);
    }
    __return_storage_ptr__->m_sector_coefficient = local_30;
    if (__return_storage_ptr__->m_sector_face_count == 0) {
      local_38 = -8882.0;
    }
    else {
      local_38 = DartSectorTheta(sector_face_count);
    }
    __return_storage_ptr__->m_sector_theta = local_38;
    SetHash(__return_storage_ptr__);
  }
  else {
    ON_SubDIncrementErrorCount();
    memcpy(__return_storage_ptr__,&Empty,0x28);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_SubDSectorType ON_SubDSectorType::CreateDartSectorType(
  unsigned int sector_face_count
  )
{
  const ON_SubDVertexTag vertex_tag = ON_SubDVertexTag::Dart;
  if ( ON_SubDSectorType_IsValidFaceCountForCreate(vertex_tag,sector_face_count) )
  {
    ON_SubDSectorType st;
    st.m_vertex_tag = vertex_tag;
    st.m_sector_face_count 
      = ON_SubDSectorType_IsValidFaceCount(vertex_tag,sector_face_count)
      ? sector_face_count
      : 0;
    st.m_sector_coefficient
      = (st.m_sector_face_count>0)
      ? ON_SubDSectorType::DartSectorCoefficient(sector_face_count)
      : ON_SubDSectorType::UnsetSectorCoefficient;
    st.m_sector_theta 
      = (st.m_sector_face_count>0)
      ? ON_SubDSectorType::DartSectorTheta(sector_face_count)
      : ON_SubDSectorType::UnsetSectorTheta;
    st.SetHash();
    return st;
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDSectorType::Empty);
}